

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

void __thiscall HttpRequest::HttpRequest(HttpRequest *this,URI *uri,MethodType type)

{
  char *data;
  string local_50;
  MethodType local_1c;
  URI *pUStack_18;
  MethodType type_local;
  URI *uri_local;
  HttpRequest *this_local;
  
  local_1c = type;
  pUStack_18 = uri;
  uri_local = (URI *)this;
  HttpHeader::HttpHeader(&this->super_HttpHeader);
  (this->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase =
       (_func_int **)&PTR__HttpRequest_00147688;
  this->mMethod = local_1c;
  URI::URI(&this->mUri,pUStack_18);
  URI::getHost_abi_cxx11_(&local_50,pUStack_18);
  data = (char *)std::__cxx11::string::c_str();
  HttpHeaderBase::addField((HttpHeaderBase *)this,0x3fe,data);
  std::__cxx11::string::~string((string *)&local_50);
  HttpHeader::addDateField(&this->super_HttpHeader);
  return;
}

Assistant:

HttpRequest::HttpRequest( const URI &uri, MethodType type ) : mMethod( type ), mUri( uri )
{
	addField( HttpFieldMap::kFieldHost, uri.getHost().c_str() );
	addDateField();
}